

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::java::IsReferenceType(JavaType type)

{
  LogMessage LStack_18;
  
  if (type < (JAVATYPE_MESSAGE|JAVATYPE_LONG)) {
    return (0x1e0U >> (type & 0x1f) & 1) != 0;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/helpers.cc"
             ,0x2a5);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&LStack_18,(char (*) [16])"Can\'t get here.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

bool IsReferenceType(JavaType type) {
  switch (type) {
    case JAVATYPE_INT:
      return false;
    case JAVATYPE_LONG:
      return false;
    case JAVATYPE_FLOAT:
      return false;
    case JAVATYPE_DOUBLE:
      return false;
    case JAVATYPE_BOOLEAN:
      return false;
    case JAVATYPE_STRING:
      return true;
    case JAVATYPE_BYTES:
      return true;
    case JAVATYPE_ENUM:
      return true;
    case JAVATYPE_MESSAGE:
      return true;

      // No default because we want the compiler to complain if any new
      // JavaTypes are added.
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return false;
}